

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

int picture_center_y_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object local_18;
  Am_Object picture;
  Am_Object *self_local;
  
  picture.data = (Am_Object_Data *)self;
  Am_Object::Get_Sibling(&local_18,(Am_Slot_Key)self,(ulong)PICTURE);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x65);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x67);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object(&local_18);
  return iVar1 + iVar2 / 2;
}

Assistant:

Am_Define_Formula(int, picture_center_y) {
  Am_Object picture = self.Get_Sibling(PICTURE);
  return (int)picture.Get(Am_TOP)+(int)picture.Get(Am_HEIGHT)/2;
}